

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

int cmcmd::SymlinkLibrary
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  bool bVar1;
  int iVar2;
  string soName;
  string name;
  string realName;
  
  std::__cxx11::string::string
            ((string *)&realName,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2));
  std::__cxx11::string::string
            ((string *)&soName,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 3));
  std::__cxx11::string::string
            ((string *)&name,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 4));
  cmsys::SystemTools::ConvertToUnixSlashes(&realName);
  cmsys::SystemTools::ConvertToUnixSlashes(&soName);
  cmsys::SystemTools::ConvertToUnixSlashes(&name);
  bVar1 = std::operator!=(&soName,&realName);
  iVar2 = 0;
  if (bVar1) {
    bVar1 = SymlinkInternal(&realName,&soName);
    if (!bVar1) {
      cmSystemTools::ReportLastSystemError("cmake_symlink_library");
      iVar2 = 1;
    }
  }
  bVar1 = std::operator!=(&name,&soName);
  if (bVar1) {
    bVar1 = SymlinkInternal(&soName,&name);
    if (!bVar1) {
      cmSystemTools::ReportLastSystemError("cmake_symlink_library");
      iVar2 = 1;
    }
  }
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&soName);
  std::__cxx11::string::~string((string *)&realName);
  return iVar2;
}

Assistant:

int cmcmd::SymlinkLibrary(std::vector<std::string> const& args)
{
  int result = 0;
  std::string realName = args[2];
  std::string soName = args[3];
  std::string name = args[4];
  cmSystemTools::ConvertToUnixSlashes(realName);
  cmSystemTools::ConvertToUnixSlashes(soName);
  cmSystemTools::ConvertToUnixSlashes(name);
  if (soName != realName) {
    if (!cmcmd::SymlinkInternal(realName, soName)) {
      cmSystemTools::ReportLastSystemError("cmake_symlink_library");
      result = 1;
    }
  }
  if (name != soName) {
    if (!cmcmd::SymlinkInternal(soName, name)) {
      cmSystemTools::ReportLastSystemError("cmake_symlink_library");
      result = 1;
    }
  }
  return result;
}